

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

shared_ptr<aeron::Subscription> __thiscall
aeron::ClientConductor::findSubscription(ClientConductor *this,int64_t registrationId)

{
  undefined4 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  long lVar3;
  SourcedException *pSVar4;
  long *plVar5;
  char *pcVar6;
  long lVar7;
  size_type *psVar8;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar9;
  long lVar10;
  shared_ptr<aeron::Subscription> sVar11;
  allocator local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(registrationId + 8));
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  lVar7 = *(long *)(registrationId + 0x60);
  lVar3 = *(long *)(registrationId + 0x68);
  lVar9 = (lVar3 - lVar7 >> 6) * -0x5555555555555555 >> 2;
  lVar10 = lVar7;
  if (0 < lVar9) {
    lVar10 = lVar9 * 0x300 + lVar7;
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + 0x180;
    do {
      if (*(long *)(lVar7 + -0x160) == in_RDX) {
        lVar7 = lVar7 + -0x180;
        goto LAB_001403f2;
      }
      if (*(long *)(lVar7 + -0xa0) == in_RDX) {
        lVar7 = lVar7 + -0xc0;
        goto LAB_001403f2;
      }
      if (*(long *)(lVar7 + 0x20) == in_RDX) goto LAB_001403f2;
      if (*(long *)(lVar7 + 0xe0) == in_RDX) {
        lVar7 = lVar7 + 0xc0;
        goto LAB_001403f2;
      }
      lVar9 = lVar9 + -1;
      lVar7 = lVar7 + 0x300;
    } while (1 < lVar9);
  }
  lVar9 = (lVar3 - lVar10 >> 6) * -0x5555555555555555;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      lVar7 = lVar3;
      if ((lVar9 != 3) || (lVar7 = lVar10, *(long *)(lVar10 + 0x20) == in_RDX)) goto LAB_001403f2;
      lVar10 = lVar10 + 0xc0;
    }
    lVar7 = lVar10;
    if (*(long *)(lVar10 + 0x20) == in_RDX) goto LAB_001403f2;
    lVar10 = lVar10 + 0xc0;
  }
  lVar7 = lVar10;
  if (*(long *)(lVar10 + 0x20) != in_RDX) {
    lVar7 = lVar3;
  }
LAB_001403f2:
  if (lVar7 == lVar3) {
    this->_vptr_ClientConductor = (_func_int **)0x0;
    (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
  }
  else {
    std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)this,lVar7 + 0x70);
    if (*(long *)(lVar7 + 0x60) != 0) {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar7 + 0x68);
      *(undefined8 *)(lVar7 + 0x60) = 0;
      *(undefined8 *)(lVar7 + 0x68) = 0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if ((this->_vptr_ClientConductor == (_func_int **)0x0) && (*(int *)(lVar7 + 0x38) == 0)) {
      if (*(long *)(registrationId + 0x1e8) == 0) {
        std::__throw_bad_function_call();
      }
      lVar3 = (**(code **)(registrationId + 0x1f0))(registrationId + 0x1d8);
      if (*(long *)(registrationId + 0x210) + *(long *)(lVar7 + 0x30) < lVar3) {
        pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
        std::operator+(&local_b0,"no response from driver in ",&local_70);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)*plVar5;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar8) {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0.field_2._8_4_ = (undefined4)plVar5[3];
          local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar8;
        }
        local_d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "std::shared_ptr<Subscription> aeron::ClientConductor::findSubscription(std::int64_t)"
                   ,"");
        pcVar6 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_50,pcVar6,&local_d1);
        util::SourcedException::SourcedException(pSVar4,&local_d0,&local_90,&local_50,0x10f);
        *(undefined ***)pSVar4 = &PTR__SourcedException_001634e0;
        __cxa_throw(pSVar4,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
    }
    else if ((this->_vptr_ClientConductor == (_func_int **)0x0) && (*(int *)(lVar7 + 0x38) == 2)) {
      pSVar4 = (SourcedException *)__cxa_allocate_exception(0x50);
      uVar1 = *(undefined4 *)(lVar7 + 0x3c);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "std::shared_ptr<Subscription> aeron::ClientConductor::findSubscription(std::int64_t)"
                 ,"");
      pcVar6 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                );
      std::__cxx11::string::string((string *)&local_b0,pcVar6,(allocator *)&local_70);
      util::SourcedException::SourcedException
                (pSVar4,(string *)(lVar7 + 0x40),&local_d0,&local_b0,0x114);
      *(undefined ***)pSVar4 = &PTR__SourcedException_001637c8;
      *(undefined4 *)(pSVar4 + 1) = uVar1;
      __cxa_throw(pSVar4,&util::RegistrationException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar11.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar11.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar11.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Subscription> ClientConductor::findSubscription(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it == m_subscriptions.end())
    {
        return std::shared_ptr<Subscription>();
    }

    SubscriptionStateDefn& state = *it;
    std::shared_ptr<Subscription> sub = state.m_subscription.lock();

    // now remove the cached value
    if (state.m_subscriptionCache)
    {
        state.m_subscriptionCache.reset();
    }

    if (!sub && RegistrationStatus::AWAITING_MEDIA_DRIVER == state.m_status)
    {
        if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
        {
            throw DriverTimeoutException(
                "no response from driver in " +  std::to_string(m_driverTimeoutMs) + " ms", SOURCEINFO);
        }
    }
    else if (!sub && RegistrationStatus::ERRORED_MEDIA_DRIVER == state.m_status)
    {
        throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
    }

    return sub;
}